

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O1

void internal_exr_destroy_context(exr_context_t ctxt)

{
  exr_memory_free_func_t UNRECOVERED_JUMPTABLE;
  exr_memory_free_func_t p_Var1;
  exr_priv_part_t cur;
  long lVar2;
  
  UNRECOVERED_JUMPTABLE = ctxt->free_fn;
  exr_attr_string_destroy(ctxt,&ctxt->filename);
  exr_attr_string_destroy(ctxt,&ctxt->tmp_filename);
  exr_attr_list_destroy(ctxt,&ctxt->custom_handlers);
  if (0 < ctxt->num_parts) {
    p_Var1 = ctxt->free_fn;
    lVar2 = 0;
    do {
      cur = ctxt->parts[lVar2];
      internal_exr_destroy_part(ctxt,cur);
      if (cur == &ctxt->first_part) {
        memset(cur,0,0x108);
      }
      else {
        (*p_Var1)(cur);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < ctxt->num_parts);
    if (1 < ctxt->num_parts) {
      (*p_Var1)(ctxt->parts);
    }
  }
  ctxt->parts = (exr_priv_part_t *)0x0;
  ctxt->num_parts = 0;
  pthread_mutex_destroy((pthread_mutex_t *)&ctxt->mutex);
  (*UNRECOVERED_JUMPTABLE)(ctxt);
  return;
}

Assistant:

void
internal_exr_destroy_context (exr_context_t ctxt)
{
    exr_memory_free_func_t dofree = ctxt->free_fn;

    exr_attr_string_destroy (ctxt, &(ctxt->filename));
    exr_attr_string_destroy (ctxt, &(ctxt->tmp_filename));
    exr_attr_list_destroy (ctxt, &(ctxt->custom_handlers));
    internal_exr_destroy_parts (ctxt);
#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
    DeleteCriticalSection (&(ctxt->mutex));
#    else
    pthread_mutex_destroy (&(ctxt->mutex));
#    endif
#endif

    dofree (ctxt);
}